

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::to_string_abi_cxx11_(measurement *measure,uint64_t match_flags)

{
  bool bVar1;
  undefined1 uVar2;
  unit units;
  reference pvVar3;
  iterator iVar4;
  measurement *in_RSI;
  string *in_RDI;
  __const_iterator __p;
  string str;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long local_1a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [12];
  measurement *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  CLI::std::ios_base::precision((ios_base *)((long)local_1a0 + *(long *)(local_1a0[0] + -0x18)),6);
  this = local_190;
  __p._M_current = (char *)measurement::value(local_10);
  std::ostream::operator<<(this,(double)__p._M_current);
  units = measurement::units(local_10);
  to_string_abi_cxx11_((unit *)units,CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  __c = units.base_units_._3_1_;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x79093e);
  if (!bVar1) {
    std::operator<<((ostream *)local_190,' ');
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                       (in_stack_fffffffffffffdd0);
    uVar2 = isNumericalStartCharacter(*pvVar3);
    if ((bool)uVar2) {
      in_stack_fffffffffffffdd0 = &local_1d0;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                (in_stack_fffffffffffffdc8);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffdd0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffdc8);
      iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert(this,__p,__c);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar2,in_stack_fffffffffffffde0),(char)((ulong)iVar4._M_current >> 0x38));
    }
    std::operator<<((ostream *)local_190,(string *)&local_1d0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(in_stack_fffffffffffffdd0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  return in_RDI;
}

Assistant:

std::string to_string(const measurement& measure, std::uint64_t match_flags)
{
    std::stringstream ss;
    ss.precision(6);
    ss << measure.value();

    auto str = to_string(measure.units(), match_flags);
    if (!str.empty()) {
        ss << ' ';
        if (isNumericalStartCharacter(str.front())) {
            str.insert(str.begin(), '(');
            str.push_back(')');
        }
        ss << str;
    }
    return ss.str();
}